

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall
Assimp::IFC::Schema_2x3::IfcCartesianPoint::IfcCartesianPoint(IfcCartesianPoint *this)

{
  IfcCartesianPoint *this_local;
  
  STEP::Object::Object((Object *)&this->field_0x58,"IfcCartesianPoint");
  IfcPoint::IfcPoint(&this->super_IfcPoint,&PTR_construction_vtable_24__010d0c38);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcCartesianPoint,_1UL>::ObjectHelper
            ((ObjectHelper<Assimp::IFC::Schema_2x3::IfcCartesianPoint,_1UL> *)
             &(this->super_IfcPoint).super_IfcGeometricRepresentationItem.field_0x30,
             &PTR_construction_vtable_24__010d0cb0);
  (this->super_IfcPoint).super_IfcGeometricRepresentationItem.super_IfcRepresentationItem.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>._vptr_ObjectHelper =
       (_func_int **)0x10d0b80;
  *(undefined8 *)&this->field_0x58 = 0x10d0c20;
  *(undefined8 *)
   &(this->super_IfcPoint).super_IfcGeometricRepresentationItem.super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x10 = 0x10d0ba8;
  *(undefined8 *)
   &(this->super_IfcPoint).super_IfcGeometricRepresentationItem.super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x20 = 0x10d0bd0;
  *(undefined8 *)&(this->super_IfcPoint).super_IfcGeometricRepresentationItem.field_0x30 = 0x10d0bf8
  ;
  STEP::ListOf<Assimp::STEP::EXPRESS::PrimitiveDataType<double>,_1UL,_3UL>::ListOf
            ((ListOf<Assimp::STEP::EXPRESS::PrimitiveDataType<double>,_1UL,_3UL> *)
             &(this->super_IfcPoint).field_0x40);
  return;
}

Assistant:

IfcCartesianPoint() : Object("IfcCartesianPoint") {}